

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

BrotliDecoderErrorCode
duckdb_brotli::DecodeMetaBlockLength(BrotliDecoderStateInternal *s,BrotliBitReader *br)

{
  uint uVar1;
  byte *pbVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  BrotliRunningMetablockHeaderState BVar8;
  
  BVar8 = s->substate_metablock_header;
  do {
    switch(BVar8) {
    case BROTLI_STATE_METABLOCK_HEADER_NONE:
      uVar3 = br->bit_pos_;
      while (uVar3 == 0) {
        pbVar2 = br->next_in;
        if (pbVar2 == br->last_in) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        br->val_ = br->val_ | (ulong)*pbVar2;
        br->bit_pos_ = 8;
        br->next_in = pbVar2 + 1;
        uVar3 = 8;
      }
      uVar4 = br->val_;
      br->bit_pos_ = uVar3 - 1;
      br->val_ = uVar4 >> 1;
      s->meta_block_remaining_len = 0;
      *(uint *)&s->field_0x304 = *(uint *)&s->field_0x304 & 0xfffffff8 | (uint)uVar4 & 1;
      BVar8 = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      if ((uVar4 & 1) != 0) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
        goto switchD_00e2598d_caseD_1;
      }
      goto LAB_00e25aef;
    case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
switchD_00e2598d_caseD_1:
      uVar3 = br->bit_pos_;
      while (uVar3 == 0) {
        pbVar2 = br->next_in;
        if (pbVar2 == br->last_in) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        br->val_ = br->val_ | (ulong)*pbVar2;
        br->bit_pos_ = 8;
        br->next_in = pbVar2 + 1;
        uVar3 = 8;
      }
      uVar7 = br->val_;
      uVar4 = uVar3 - 1;
      br->bit_pos_ = uVar4;
      br->val_ = uVar7 >> 1;
      if ((uVar7 & 1) != 0) goto LAB_00e25de6;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
      uVar4 = br->bit_pos_;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_SIZE:
      uVar5 = s->loop_counter;
      uVar6 = *(uint *)&s->field_0x304;
LAB_00e25bc8:
      while ((int)uVar5 < (int)(uVar6 >> 0xc & 0xff)) {
        uVar7 = br->bit_pos_ | 8;
        uVar4 = br->bit_pos_;
        while (uVar4 < 4) {
          pbVar2 = br->next_in;
          if (pbVar2 == br->last_in) {
LAB_00e25db3:
            s->loop_counter = uVar5;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          br->val_ = br->val_ | (ulong)*pbVar2 << ((byte)uVar4 & 0x3f);
          br->bit_pos_ = uVar7;
          br->next_in = pbVar2 + 1;
          uVar4 = uVar7;
        }
        uVar7 = br->val_;
        br->bit_pos_ = uVar4 - 4;
        br->val_ = uVar7 >> 4;
        uVar1 = uVar5 + 1;
        uVar6 = *(uint *)&s->field_0x304;
        if ((uVar1 == (uVar6 >> 0xc & 0xff)) && (4 < uVar1 && (uVar7 & 0xf) == 0)) {
          return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE;
        }
        s->meta_block_remaining_len =
             s->meta_block_remaining_len | ((uint)uVar7 & 0xf) << ((byte)(uVar5 << 2) & 0x3f);
        uVar5 = uVar1;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
LAB_00e25b4d:
      if ((uVar6 & 1) == 0) {
        uVar3 = br->bit_pos_;
        while (uVar3 == 0) {
          pbVar2 = br->next_in;
          if (pbVar2 == br->last_in) {
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          br->val_ = br->val_ | (ulong)*pbVar2;
          br->bit_pos_ = 8;
          br->next_in = pbVar2 + 1;
          uVar3 = 8;
        }
        uVar4 = br->val_;
        br->bit_pos_ = uVar3 - 1;
        br->val_ = uVar4 >> 1;
        *(uint *)&s->field_0x304 = (*(uint *)&s->field_0x304 & 0xfffffffd) + ((uint)uVar4 & 1) * 2;
      }
LAB_00e25de0:
      s->meta_block_remaining_len = s->meta_block_remaining_len + 1;
LAB_00e25de6:
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
      return BROTLI_DECODER_SUCCESS;
    case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
      uVar6 = *(uint *)&s->field_0x304;
      goto LAB_00e25b4d;
    case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
      uVar3 = br->bit_pos_;
      while (uVar3 == 0) {
        pbVar2 = br->next_in;
        if (pbVar2 == br->last_in) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        br->val_ = br->val_ | (ulong)*pbVar2;
        br->bit_pos_ = 8;
        br->next_in = pbVar2 + 1;
        uVar3 = 8;
      }
      uVar7 = br->val_;
      uVar4 = uVar3 - 1;
      br->bit_pos_ = uVar4;
      br->val_ = uVar7 >> 1;
      if ((uVar7 & 1) != 0) {
        return BROTLI_DECODER_ERROR_FORMAT_RESERVED;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
LAB_00e25c96:
      uVar7 = uVar4;
      while (uVar7 < 2) {
        pbVar2 = br->next_in;
        if (pbVar2 == br->last_in) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        br->val_ = br->val_ | (ulong)*pbVar2 << ((byte)uVar7 & 0x3f);
        br->bit_pos_ = uVar4 | 8;
        br->next_in = pbVar2 + 1;
        uVar7 = uVar4 | 8;
      }
      uVar4 = br->val_;
      br->bit_pos_ = uVar7 - 2;
      br->val_ = uVar4 >> 2;
      uVar4 = uVar4 & 3;
      if (uVar4 == 0) goto LAB_00e25de6;
      uVar6 = *(uint *)&s->field_0x304 & 0xfff00fff | (int)uVar4 << 0xc;
      *(uint *)&s->field_0x304 = uVar6;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
LAB_00e25d0e:
      uVar5 = s->loop_counter;
      while ((int)uVar5 < (int)(uVar6 >> 0xc & 0xff)) {
        uVar7 = br->bit_pos_ | 8;
        uVar4 = br->bit_pos_;
        while (uVar4 < 8) {
          pbVar2 = br->next_in;
          if (pbVar2 == br->last_in) goto LAB_00e25db3;
          br->val_ = br->val_ | (ulong)*pbVar2 << ((byte)uVar4 & 0x3f);
          br->bit_pos_ = uVar7;
          br->next_in = pbVar2 + 1;
          uVar4 = uVar7;
        }
        uVar7 = br->val_ & 0xff;
        br->bit_pos_ = uVar4 - 8;
        br->val_ = br->val_ >> 8;
        uVar1 = uVar5 + 1;
        uVar6 = *(uint *)&s->field_0x304;
        if ((uVar1 == (uVar6 >> 0xc & 0xff)) && (1 < uVar1 && uVar7 == 0)) {
          return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE;
        }
        s->meta_block_remaining_len =
             s->meta_block_remaining_len | (uint)(uVar7 << ((byte)(uVar5 << 3) & 0x3f));
        uVar5 = uVar1;
      }
      goto LAB_00e25de0;
    case BROTLI_STATE_METABLOCK_HEADER_BYTES:
      uVar4 = br->bit_pos_;
      goto LAB_00e25c96;
    case BROTLI_STATE_METABLOCK_HEADER_METADATA:
      uVar6 = *(uint *)&s->field_0x304;
      goto LAB_00e25d0e;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
    uVar7 = uVar4;
    while (uVar7 < 2) {
      pbVar2 = br->next_in;
      if (pbVar2 == br->last_in) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      br->val_ = br->val_ | (ulong)*pbVar2 << ((byte)uVar7 & 0x3f);
      br->bit_pos_ = uVar4 | 8;
      br->next_in = pbVar2 + 1;
      uVar7 = uVar4 | 8;
    }
    uVar5 = (uint)br->val_ & 3;
    br->bit_pos_ = uVar7 - 2;
    br->val_ = br->val_ >> 2;
    uVar6 = (*(uint *)&s->field_0x304 & 0xfff00fff) + uVar5 * 0x1000 + 0x4000;
    *(uint *)&s->field_0x304 = uVar6;
    s->loop_counter = 0;
    if (uVar5 != 3) {
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
      uVar5 = 0;
      goto LAB_00e25bc8;
    }
    *(uint *)&s->field_0x304 = uVar6 | 4;
    BVar8 = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
LAB_00e25aef:
    s->substate_metablock_header = BVar8;
  } while( true );
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE DecodeMetaBlockLength(BrotliDecoderState *s, BrotliBitReader *br) {
	brotli_reg_t bits;
	int i;
	for (;;) {
		switch (s->substate_metablock_header) {
		case BROTLI_STATE_METABLOCK_HEADER_NONE:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->is_last_metablock = bits ? 1 : 0;
			s->meta_block_remaining_len = 0;
			s->is_uncompressed = 0;
			s->is_metadata = 0;
			if (!s->is_last_metablock) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
				break;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
				return BROTLI_DECODER_SUCCESS;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
			if (!BrotliSafeReadBits(br, 2, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->size_nibbles = (uint8_t)(bits + 4);
			s->loop_counter = 0;
			if (bits == 3) {
				s->is_metadata = 1;
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
				break;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_SIZE:
			i = s->loop_counter;
			for (; i < (int)s->size_nibbles; ++i) {
				if (!BrotliSafeReadBits(br, 4, &bits)) {
					s->loop_counter = i;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 4 && bits == 0) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE);
				}
				s->meta_block_remaining_len |= (int)(bits << (i * 4));
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
			if (!s->is_last_metablock) {
				if (!BrotliSafeReadBits(br, 1, &bits)) {
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				s->is_uncompressed = bits ? 1 : 0;
			}
			++s->meta_block_remaining_len;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
			return BROTLI_DECODER_SUCCESS;

		case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits != 0) {
				return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_RESERVED);
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_BYTES:
			if (!BrotliSafeReadBits(br, 2, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits == 0) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
				return BROTLI_DECODER_SUCCESS;
			}
			s->size_nibbles = (uint8_t)bits;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_METADATA:
			i = s->loop_counter;
			for (; i < (int)s->size_nibbles; ++i) {
				if (!BrotliSafeReadBits(br, 8, &bits)) {
					s->loop_counter = i;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 1 && bits == 0) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE);
				}
				s->meta_block_remaining_len |= (int)(bits << (i * 8));
			}
			++s->meta_block_remaining_len;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
			return BROTLI_DECODER_SUCCESS;

		default:
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
		}
	}
}